

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O2

int rtosc_count_printed_arg_vals_of_msg(char *msg)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  ushort **ppuVar4;
  char *src;
  _func_int_int *in_RSI;
  char *local_28;
  
  local_28 = msg;
  skip_while(&local_28,in_RSI);
  while( true ) {
    cVar2 = *local_28;
    if (cVar2 != '%') break;
    skip_fmt(&local_28,"%*[^\n] %n");
  }
  if (cVar2 == '\0') {
    iVar3 = -0x80000000;
  }
  else {
    src = local_28;
    if (cVar2 == '/') {
      while (cVar2 != '\0') {
        ppuVar4 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar4 + (long)cVar2 * 2 + 1) & 0x20) != 0) break;
        pcVar1 = src + 1;
        src = src + 1;
        cVar2 = *pcVar1;
      }
      iVar3 = rtosc_count_printed_arg_vals(src);
      return iVar3;
    }
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int rtosc_count_printed_arg_vals_of_msg(const char* msg)
{
    skip_while(&msg, isspace);
    while (*msg == '%')
        skip_fmt(&msg, "%*[^\n] %n");

    if (*msg == '/') {
        for(; *msg && !isspace(*msg); ++msg);
        return rtosc_count_printed_arg_vals(msg);
    }
    else if(!*msg)
        return INT_MIN;
    else
        return -1;
}